

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3ExprLocalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pCsr;
  byte *local_30;
  
  iVar2 = *(int *)((long)pCtx + 8);
  if (iVar2 < 1) {
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    do {
      iVar4 = sqlite3Fts3EvalPhrasePoslist(*pCtx,pExpr,(int)lVar6,(char **)&local_30);
      iVar5 = 0;
      if (local_30 != (byte *)0x0) {
        bVar1 = *local_30;
        iVar5 = 0;
        if (1 < bVar1) {
          iVar5 = 0;
          do {
            bVar3 = bVar1 & 0x80;
            iVar5 = iVar5 + (bVar1 >> 7 ^ 1);
            bVar1 = local_30[1];
            local_30 = local_30 + 1;
          } while ((bVar1 & 0xfe) != 0 || bVar3 != 0);
        }
      }
      *(int *)(*(long *)((long)pCtx + 0x20) + (long)(((int)lVar6 + iVar2 * iPhrase) * 3) * 4) =
           iVar5;
      lVar6 = lVar6 + 1;
    } while ((lVar6 < *(int *)((long)pCtx + 8)) && (iVar4 == 0));
  }
  return iVar4;
}

Assistant:

static int fts3ExprLocalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  int rc = SQLITE_OK;
  MatchInfo *p = (MatchInfo *)pCtx;
  int iStart = iPhrase * p->nCol * 3;
  int i;

  for(i=0; i<p->nCol && rc==SQLITE_OK; i++){
    char *pCsr;
    rc = sqlite3Fts3EvalPhrasePoslist(p->pCursor, pExpr, i, &pCsr);
    if( pCsr ){
      p->aMatchinfo[iStart+i*3] = fts3ColumnlistCount(&pCsr);
    }else{
      p->aMatchinfo[iStart+i*3] = 0;
    }
  }

  return rc;
}